

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int find_bracket(char **string)

{
  int iVar1;
  char *local_20;
  char *tstr;
  char **string_local;
  
  local_20 = *string;
  tstr = (char *)string;
  while( true ) {
    if (*local_20 == '\0') {
      return 1;
    }
    if (*local_20 == ']') break;
    if (*local_20 == '(') {
      local_20 = local_20 + 1;
      iVar1 = find_paren(&local_20);
      if (iVar1 != 0) {
        return 1;
      }
    }
    else if (*local_20 == '[') {
      local_20 = local_20 + 1;
      iVar1 = find_bracket(&local_20);
      if (iVar1 != 0) {
        return 1;
      }
    }
    else if (*local_20 == '{') {
      local_20 = local_20 + 1;
      iVar1 = find_curlybracket(&local_20);
      if (iVar1 != 0) {
        return 1;
      }
    }
    else if (*local_20 == '\"') {
      local_20 = local_20 + 1;
      iVar1 = find_doublequote(&local_20);
      if (iVar1 != 0) {
        return 1;
      }
    }
    else if (*local_20 == '\'') {
      local_20 = local_20 + 1;
      iVar1 = find_quote(&local_20);
      if (iVar1 != 0) {
        return 1;
      }
    }
    else {
      local_20 = local_20 + 1;
    }
  }
  *(char **)tstr = local_20 + 1;
  return 0;
}

Assistant:

static int find_bracket(char **string)

/*  
    look for the closing bracket character in the input string
*/
{
    char *tstr;

    tstr = *string;

    while (*tstr) {
        if (*tstr == ']') { /* found the closing bracket */
           *string = tstr + 1;  /* set pointer to next char */
           return(0); 
        } else if (*tstr == '(') { /* found another level of parens */
           tstr++;
           if (find_paren(&tstr)) return(1); 
        } else if (*tstr == '[') { 
           tstr++;
           if (find_bracket(&tstr)) return(1);
        } else if (*tstr == '{') { 
           tstr++;
           if (find_curlybracket(&tstr)) return(1);
        } else if (*tstr == '"') { 
           tstr++;
           if (find_doublequote(&tstr)) return(1);
        } else if (*tstr == '\'') { 
           tstr++;
           if (find_quote(&tstr)) return(1);
        } else { 
           tstr++;
        }
    }
    return(1);  /* opps, didn't find the closing character */
}